

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_neon_mull(TCGContext_conflict1 *tcg_ctx,TCGv_i64 dest,TCGv_i32 a,TCGv_i32 b,int size,int u)

{
  TCGv_i32 rl;
  TCGv_i32 rh;
  TCGv_i64 dest_00;
  uintptr_t o_1;
  code *func;
  uintptr_t o_2;
  uintptr_t o;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  
  switch(size * 2 | u) {
  case 0:
    func = helper_neon_mull_s8_aarch64;
    break;
  case 1:
    func = helper_neon_mull_u8_aarch64;
    break;
  case 2:
    func = helper_neon_mull_s16_aarch64;
    break;
  case 3:
    func = helper_neon_mull_u16_aarch64;
    break;
  case 4:
    rl = tcg_temp_new_i32(tcg_ctx);
    rh = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_muls2_i32_aarch64(tcg_ctx,rl,rh,a,b);
    goto LAB_005efd22;
  case 5:
    rl = tcg_temp_new_i32(tcg_ctx);
    rh = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_mulu2_i32_aarch64(tcg_ctx,rl,rh,a,b);
LAB_005efd22:
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(a + (long)&tcg_ctx->pool_cur));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(b + (long)&tcg_ctx->pool_cur));
    dest_00 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_concat_i32_i64_aarch64(tcg_ctx,dest_00,rl,rh);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(rl + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(rh + (long)tcg_ctx));
    tcg_gen_mov_i64_aarch64(tcg_ctx,dest,dest_00);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(dest_00 + (long)tcg_ctx));
    goto LAB_005efd9c;
  default:
    abort();
  }
  local_40 = b + (long)&tcg_ctx->pool_cur;
  local_48 = (TCGTemp *)(a + (long)&tcg_ctx->pool_cur);
  tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)(dest + (long)tcg_ctx),2,&local_48);
LAB_005efd9c:
  if (size < 2) {
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(a + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(b + (long)tcg_ctx));
  }
  return;
}

Assistant:

static inline void gen_neon_mull(TCGContext *tcg_ctx, TCGv_i64 dest, TCGv_i32 a, TCGv_i32 b,
                                 int size, int u)
{
    TCGv_i64 tmp;

    switch ((size << 1) | u) {
    case 0: gen_helper_neon_mull_s8(tcg_ctx, dest, a, b); break;
    case 1: gen_helper_neon_mull_u8(tcg_ctx, dest, a, b); break;
    case 2: gen_helper_neon_mull_s16(tcg_ctx, dest, a, b); break;
    case 3: gen_helper_neon_mull_u16(tcg_ctx, dest, a, b); break;
    case 4:
        tmp = gen_muls_i64_i32(tcg_ctx, a, b);
        tcg_gen_mov_i64(tcg_ctx, dest, tmp);
        tcg_temp_free_i64(tcg_ctx, tmp);
        break;
    case 5:
        tmp = gen_mulu_i64_i32(tcg_ctx, a, b);
        tcg_gen_mov_i64(tcg_ctx, dest, tmp);
        tcg_temp_free_i64(tcg_ctx, tmp);
        break;
    default: abort();
    }

    /* gen_helper_neon_mull_[su]{8|16} do not free their parameters.
       Don't forget to clean them now.  */
    if (size < 2) {
        tcg_temp_free_i32(tcg_ctx, a);
        tcg_temp_free_i32(tcg_ctx, b);
    }
}